

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printReturn(JSPrinter *this,Ref node)

{
  Ref *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"return");
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  uVar1 = cashew::Ref::operator!(this_00);
  if ((uVar1 & 1) == 0) {
    emit(this,' ');
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
    print(this,(Value *)*puVar2);
  }
  return;
}

Assistant:

void printReturn(Ref node) {
    emit("return");
    if (!!node[1]) {
      emit(' ');
      print(node[1]);
    }
  }